

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O2

int __thiscall FIX::FileLog::init(FileLog *this,EVP_PKEY_CTX *ctx)

{
  string *__lhs;
  char cVar1;
  int iVar2;
  ConfigError *pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  file_mkdir(*(char **)ctx);
  file_mkdir((in_RDX->_M_dataplus)._M_p);
  if (*(long *)(ctx + 8) == 0) {
    std::__cxx11::string::assign((char *)ctx);
  }
  if (in_RDX->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)in_RDX);
  }
  std::operator+(&local_50,in_RCX,".");
  file_appendpath(&local_70,(string *)ctx,&local_50);
  __lhs = &this->m_fullPrefix;
  std::__cxx11::string::operator=((string *)__lhs,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_50,in_RCX,".");
  file_appendpath(&local_70,in_RDX,&local_50);
  std::__cxx11::string::operator=((string *)&this->m_fullBackupPrefix,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_70,__lhs,"messages.current.log");
  std::__cxx11::string::operator=((string *)&this->m_messagesFileName,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::operator+(&local_70,__lhs,"event.current.log");
  std::__cxx11::string::operator=((string *)&this->m_eventFileName,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::ofstream::open((char *)&this->m_messages,
                      (_Ios_Openmode)(this->m_messagesFileName)._M_dataplus._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ofstream::open((char *)&this->m_event,
                        (_Ios_Openmode)(this->m_eventFileName)._M_dataplus._M_p);
    iVar2 = std::__basic_file<char>::is_open();
    if ((char)iVar2 != '\0') {
      return iVar2;
    }
    pCVar3 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_70,"Could not open event file: ",&this->m_eventFileName);
    ConfigError::ConfigError(pCVar3,&local_70);
    __cxa_throw(pCVar3,&ConfigError::typeinfo,Exception::~Exception);
  }
  pCVar3 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_70,"Could not open messages file: ",&this->m_messagesFileName);
  ConfigError::ConfigError(pCVar3,&local_70);
  __cxa_throw(pCVar3,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

void FileLog::init( std::string path, std::string backupPath, const std::string& prefix )
{
  file_mkdir( path.c_str() );
  file_mkdir( backupPath.c_str() );

  if ( path.empty() ) path = ".";
  if ( backupPath.empty() ) backupPath = path;

  m_fullPrefix
    = file_appendpath(path, prefix + ".");
  m_fullBackupPrefix
    = file_appendpath(backupPath, prefix + ".");

  m_messagesFileName = m_fullPrefix + "messages.current.log";
  m_eventFileName = m_fullPrefix + "event.current.log";

  m_messages.open( m_messagesFileName.c_str(), std::ios::out | std::ios::app );
  if ( !m_messages.is_open() ) throw ConfigError( "Could not open messages file: " + m_messagesFileName );
  m_event.open( m_eventFileName.c_str(), std::ios::out | std::ios::app );
  if ( !m_event.is_open() ) throw ConfigError( "Could not open event file: " + m_eventFileName );
}